

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS
ref_metric_sub_tet_complexity
          (REF_INT n0,REF_INT n1,REF_INT n2,REF_INT n3,REF_INT *nodes,REF_DBL *metric,
          REF_DBL *complexity,REF_NODE ref_node)

{
  uint uVar1;
  double dVar2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT tet_nodes [4];
  double dStack_40;
  REF_INT cell_node;
  REF_DBL det;
  REF_DBL volume;
  REF_DBL *metric_local;
  REF_INT *nodes_local;
  REF_INT local_18;
  REF_INT n3_local;
  REF_INT n2_local;
  REF_INT n1_local;
  REF_INT n0_local;
  
  ref_private_macro_code_rss_1 = nodes[n0];
  ref_private_macro_code_rss = nodes[n1];
  tet_nodes[0] = nodes[n2];
  tet_nodes[1] = nodes[n3];
  volume = (REF_DBL)metric;
  metric_local = (REF_DBL *)nodes;
  nodes_local._4_4_ = n3;
  local_18 = n2;
  n3_local = n1;
  n2_local = n0;
  uVar1 = ref_node_tet_vol(ref_node,&ref_private_macro_code_rss_1,&det);
  if (uVar1 == 0) {
    for (tet_nodes[3] = 0; tet_nodes[3] < 4; tet_nodes[3] = tet_nodes[3] + 1) {
      if (ref_node->ref_mpi->id == ref_node->part[(&ref_private_macro_code_rss_1)[tet_nodes[3]]]) {
        uVar1 = ref_matrix_det_m((REF_DBL *)
                                 ((long)volume +
                                 (long)((&ref_private_macro_code_rss_1)[tet_nodes[3]] * 6) * 8),
                                 &stack0xffffffffffffffc0);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x740,"ref_metric_sub_tet_complexity",(ulong)uVar1,"det");
          return uVar1;
        }
        if (0.0 < dStack_40) {
          dVar2 = sqrt(dStack_40);
          *complexity = (dVar2 * det) / 4.0 + *complexity;
        }
      }
    }
    n1_local = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x73d,
           "ref_metric_sub_tet_complexity",(ulong)uVar1,"vol");
    n1_local = uVar1;
  }
  return n1_local;
}

Assistant:

REF_FCN static REF_STATUS ref_metric_sub_tet_complexity(
    REF_INT n0, REF_INT n1, REF_INT n2, REF_INT n3, REF_INT *nodes,
    REF_DBL *metric, REF_DBL *complexity, REF_NODE ref_node) {
  REF_DBL volume, det;
  REF_INT cell_node;
  REF_INT tet_nodes[4];
  tet_nodes[0] = nodes[n0];
  tet_nodes[1] = nodes[n1];
  tet_nodes[2] = nodes[n2];
  tet_nodes[3] = nodes[n3];
  RSS(ref_node_tet_vol(ref_node, tet_nodes, &volume), "vol");
  for (cell_node = 0; cell_node < 4; cell_node++) {
    if (ref_node_owned(ref_node, tet_nodes[cell_node])) {
      RSS(ref_matrix_det_m(&(metric[6 * tet_nodes[cell_node]]), &det), "det");
      if (det > 0.0) {
        (*complexity) += sqrt(det) * volume / 4.0;
      }
    }
  }

  return REF_SUCCESS;
}